

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O1

bool __thiscall
axl::sl::Array<void*,axl::sl::ArrayDetails<void*>>::
setCountImpl<axl::sl::SimpleArrayDetails<void*>::Construct>
          (Array<void*,axl::sl::ArrayDetails<void*>> *this,size_t count)

{
  int *piVar1;
  long lVar2;
  undefined8 *puVar3;
  BufHdr *pBVar4;
  size_t sVar5;
  EVP_PKEY_CTX *dst;
  BufHdr *dst_00;
  size_t size;
  bool bVar6;
  Ptr<axl::rc::BufHdr> hdr;
  Ptr<axl::rc::BufHdr> local_38;
  
  size = count * 8;
  lVar2 = *(long *)(this + 8);
  if ((lVar2 != 0) && (*(int *)(lVar2 + 0x10) == 1)) {
    bVar6 = true;
    if (*(size_t *)(this + 0x10) == count) {
      return true;
    }
    if (size <= *(ulong *)(lVar2 + 0x18)) goto LAB_0012d053;
  }
  if (count == 0) {
    ArrayRef<void_*,_axl::sl::ArrayDetails<void_*>_>::release
              ((ArrayRef<void_*,_axl::sl::ArrayDetails<void_*>_> *)this);
    return true;
  }
  if (*(long *)(this + 0x10) != 0) {
    sVar5 = getAllocSize<4096ul>(size);
    dst = (EVP_PKEY_CTX *)operator_new(sVar5 + 0x28,(nothrow_t *)&std::nothrow);
    *(undefined4 *)(dst + 0x10) = 0;
    *(undefined4 *)(dst + 0x14) = 1;
    *(undefined ***)dst = &PTR__RefCount_0019ca28;
    *(size_t *)(dst + 0x18) = sVar5;
    *(undefined8 *)(dst + 0x20) = 0;
    *(code **)(dst + 8) = mem::deallocate;
    local_38.m_p = (BufHdr *)0x0;
    local_38.m_refCount = (RefCount *)0x0;
    rc::Ptr<axl::rc::BufHdr>::copy(&local_38,dst,dst);
    bVar6 = local_38.m_p != (BufHdr *)0x0;
    if (bVar6) {
      dst_00 = local_38.m_p + 1;
      if (*(ulong *)(this + 0x10) < count) {
        size = *(ulong *)(this + 0x10) * 8;
      }
      __wrap_memcpy(dst_00,*(void **)this,size);
      puVar3 = *(undefined8 **)(this + 8);
      LOCK();
      piVar1 = (int *)(puVar3 + 2);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        (**(code **)*puVar3)(puVar3);
        LOCK();
        piVar1 = (int *)((long)puVar3 + 0x14);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if ((*piVar1 == 0) && ((code *)puVar3[1] != (code *)0x0)) {
          (*(code *)puVar3[1])(puVar3);
        }
      }
      pBVar4 = local_38.m_p;
      *(BufHdr **)this = dst_00;
      local_38.m_p = (BufHdr *)0x0;
      local_38.m_refCount = (RefCount *)0x0;
      *(BufHdr **)(this + 8) = pBVar4;
      *(size_t *)(this + 0x10) = count;
    }
    rc::Ptr<axl::rc::BufHdr>::clear(&local_38);
    return bVar6;
  }
  bVar6 = Array<void_*,_axl::sl::ArrayDetails<void_*>_>::reserve
                    ((Array<void_*,_axl::sl::ArrayDetails<void_*>_> *)this,count);
  if (!bVar6) {
    return bVar6;
  }
LAB_0012d053:
  *(size_t *)(this + 0x10) = count;
  return bVar6;
}

Assistant:

bool
	setCountImpl(size_t count) {
		size_t size = count * sizeof(T);

		if (this->m_hdr &&
			this->m_hdr->getRefCount() == 1) {
			if (this->m_count == count)
				return true;

			if (this->m_hdr->m_bufferSize >= size) {
				if (count > this->m_count)
					Construct() (this->m_p + this->m_count, count - this->m_count);
				else
					Details::destruct(this->m_p + count, this->m_count - count);

				Details::setHdrCount(this->m_hdr, count);
				this->m_count = count;
				return true;
			}
		}

		if (count == 0) {
			this->release();
			return true;
		}

		if (!this->m_count) {
			bool result = reserve(count);
			if (!result)
				return false;

			Construct() (this->m_p, count);
			Details::setHdrCount(this->m_hdr, count);
			this->m_count = count;
			return true;
		}

		ASSERT(this->m_hdr);

		size_t bufferSize = getAllocSize(size);

		rc::Ptr<Hdr> hdr = AXL_RC_NEW_ARGS_EXTRA(Hdr, (bufferSize), bufferSize);
		if (!hdr)
			return false;

		Details::setHdrCount(hdr, count);

		T* p = (T*)(hdr + 1);

		if (count <= this->m_count) {
			Details::constructCopy(p, this->m_p, count);
		} else {
			Details::constructCopy(p, this->m_p, this->m_count);
			Construct() (p + this->m_count, count - this->m_count);
		}

		this->m_hdr->release();

		this->m_p = p;
		this->m_hdr = hdr.detach();
		this->m_count = count;
		return true;
	}